

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psblues.c
# Opt level: O0

void cf2_blues_init(CF2_Blues blues,CF2_Font font)

{
  int iVar1;
  int iVar2;
  FT_Fast FVar3;
  FT_Int32 FVar4;
  int iVar5;
  FT_Bool *pFVar6;
  FT_Long FVar7;
  undefined4 uVar8;
  long lVar9;
  int local_a4;
  int local_a0;
  int local_9c;
  CF2_F16Dot16 flatEdge;
  CF2_F16Dot16 diff;
  CF2_F16Dot16 flatFamilyEdge;
  CF2_F16Dot16 minDiff;
  size_t j;
  CF2_F16Dot16 emBoxTop;
  CF2_F16Dot16 emBoxBottom;
  size_t i;
  FT_Pos *familyOtherBlues;
  FT_Pos *familyBlues;
  FT_Pos *otherBlues;
  FT_Pos *blueValues;
  size_t numFamilyOtherBlues;
  size_t numFamilyBlues;
  size_t numOtherBlues;
  size_t numBlueValues;
  int local_28;
  CF2_F16Dot16 csUnitsPerPixel;
  CF2_F16Dot16 maxZoneHeight;
  CF2_F16Dot16 zoneHeight;
  PS_Decoder *decoder;
  CF2_Font font_local;
  CF2_Blues blues_local;
  
  _maxZoneHeight = font->decoder;
  local_28 = 0;
  decoder = (PS_Decoder *)font;
  font_local = (CF2_Font)blues;
  memset(blues,0,0x150);
  *(undefined4 *)&font_local->memory = *(undefined4 *)&(decoder->builder).pos_y;
  cf2_getBlueMetrics(_maxZoneHeight,(CF2_F16Dot16 *)&font_local->isT1,&font_local->renderingFlags,
                     &(font_local->currentTransform).a);
  cf2_getBlueValues(_maxZoneHeight,&numOtherBlues,&otherBlues);
  cf2_getOtherBlues(_maxZoneHeight,&numFamilyBlues,&familyBlues);
  cf2_getFamilyBlues(_maxZoneHeight,&numFamilyOtherBlues,&familyOtherBlues);
  cf2_getFamilyOtherBlues(_maxZoneHeight,(size_t *)&blueValues,(FT_Pos **)&i);
  FVar3 = cf2_getLanguageGroup(_maxZoneHeight);
  if ((FVar3 == 1) &&
     ((numOtherBlues == 0 ||
      ((((numOtherBlues == 4 && ((int)*otherBlues * 0x10000 < -0x780000)) &&
        ((int)otherBlues[1] * 0x10000 < -0x780000)) &&
       ((0x3700000 < (int)otherBlues[2] * 0x10000 && (0x3700000 < (int)otherBlues[3] * 0x10000))))))
     )) {
    (font_local->outerTransform).d = -0x780001;
    FVar4 = FT_MulFix_x86_64((font_local->outerTransform).d,*(FT_Int32 *)&font_local->memory);
    (font_local->outerTransform).tx = (FVar4 + 0x8000U & 0xffff0000) - 0x8000;
    (font_local->outerTransform).ty = *(CF2_F16Dot16 *)&font_local->memory;
    (font_local->innerTransform).ty = 0x31;
    (font_local->innerTransform).b = (int)decoder->stack[0x18] * 2 + 0x3700001;
    FVar4 = FT_MulFix_x86_64((font_local->innerTransform).b,*(FT_Int32 *)&font_local->memory);
    (font_local->innerTransform).c = (FVar4 + 0x8000U & 0xffff0000) + 0x8000;
    (font_local->innerTransform).d = *(CF2_F16Dot16 *)&font_local->memory;
    (font_local->currentTransform).d = 0x32;
    *(undefined1 *)((long)&font_local->error + 1) = 1;
  }
  else {
    for (_emBoxTop = 0; _emBoxTop < numOtherBlues; _emBoxTop = _emBoxTop + 2) {
      *(int *)(&(font_local->blend).builtBV + (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14
              ) = (int)otherBlues[_emBoxTop] << 0x10;
      *(int *)(&(font_local->blend).field_0x4 +
              (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14) =
           (int)otherBlues[_emBoxTop + 1] << 0x10;
      csUnitsPerPixel =
           *(int *)(&(font_local->blend).field_0x4 +
                   (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14) -
           *(int *)(&(font_local->blend).builtBV +
                   (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14);
      if (-1 < csUnitsPerPixel) {
        if (local_28 < csUnitsPerPixel) {
          local_28 = csUnitsPerPixel;
        }
        if (_emBoxTop == 0) {
          *(undefined1 *)
           (&(font_local->blend).lastVsindex + (ulong)*(uint *)((long)&font_local->memory + 4) * 5)
               = 1;
          *(undefined4 *)
           ((long)&(font_local->blend).font + (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14
           ) = *(undefined4 *)
                (&(font_local->blend).field_0x4 +
                (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14);
        }
        else {
          lVar9 = (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14;
          *(int *)(&(font_local->blend).field_0x4 + lVar9) =
               (int)decoder->stack[0x18] * 2 + *(int *)(&(font_local->blend).field_0x4 + lVar9);
          pFVar6 = &(font_local->blend).builtBV +
                   (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14;
          *(int *)pFVar6 = (int)decoder->stack[0x18] * 2 + *(int *)pFVar6;
          *(undefined1 *)
           (&(font_local->blend).lastVsindex + (ulong)*(uint *)((long)&font_local->memory + 4) * 5)
               = 0;
          *(undefined4 *)
           ((long)&(font_local->blend).font + (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14
           ) = *(undefined4 *)
                (&(font_local->blend).builtBV +
                (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14);
        }
        *(int *)((long)&font_local->memory + 4) = *(int *)((long)&font_local->memory + 4) + 1;
      }
    }
    for (_emBoxTop = 0; _emBoxTop < numFamilyBlues; _emBoxTop = _emBoxTop + 2) {
      *(int *)(&(font_local->blend).builtBV + (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14
              ) = (int)familyBlues[_emBoxTop] << 0x10;
      *(int *)(&(font_local->blend).field_0x4 +
              (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14) =
           (int)familyBlues[_emBoxTop + 1] << 0x10;
      csUnitsPerPixel =
           *(int *)(&(font_local->blend).field_0x4 +
                   (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14) -
           *(int *)(&(font_local->blend).builtBV +
                   (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14);
      if (-1 < csUnitsPerPixel) {
        if (local_28 < csUnitsPerPixel) {
          local_28 = csUnitsPerPixel;
        }
        *(undefined1 *)
         (&(font_local->blend).lastVsindex + (ulong)*(uint *)((long)&font_local->memory + 4) * 5) =
             1;
        *(undefined4 *)
         ((long)&(font_local->blend).font + (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14)
             = *(undefined4 *)
                (&(font_local->blend).field_0x4 +
                (ulong)*(uint *)((long)&font_local->memory + 4) * 0x14);
        *(int *)((long)&font_local->memory + 4) = *(int *)((long)&font_local->memory + 4) + 1;
      }
    }
    FVar7 = FT_DivFix(0x10000,(long)*(int *)&font_local->memory);
    numBlueValues._4_4_ = (int)FVar7;
    for (_emBoxTop = 0; _emBoxTop < *(uint *)((long)&font_local->memory + 4);
        _emBoxTop = _emBoxTop + 1) {
      local_a0 = *(int *)((long)&(font_local->blend).font + _emBoxTop * 0x14);
      if ((char)(&(font_local->blend).lastVsindex)[_emBoxTop * 5] == '\0') {
        diff = 0x7fffffff;
        for (_flatFamilyEdge = (FT_Pos *)0x2; _flatFamilyEdge < numFamilyOtherBlues;
            _flatFamilyEdge = (FT_Pos *)((long)_flatFamilyEdge + 2)) {
          iVar5 = (int)decoder->stack[0x18] * 2 +
                  (int)familyOtherBlues[(long)_flatFamilyEdge] * 0x10000;
          if (local_a0 - iVar5 < 0) {
            local_a4 = -(local_a0 - iVar5);
          }
          else {
            local_a4 = local_a0 - iVar5;
          }
          if ((local_a4 < diff) && (local_a4 < numBlueValues._4_4_)) {
            *(int *)((long)&(font_local->blend).font + _emBoxTop * 0x14) = iVar5;
            diff = local_a4;
            if (local_a4 == 0) break;
          }
        }
      }
      else {
        diff = 0x7fffffff;
        for (_flatFamilyEdge = (FT_Pos *)0x0; _flatFamilyEdge < blueValues;
            _flatFamilyEdge = (FT_Pos *)((long)_flatFamilyEdge + 2)) {
          iVar5 = (int)*(undefined8 *)(i + 8 + (long)_flatFamilyEdge * 8);
          if (local_a0 + iVar5 * -0x10000 < 0) {
            local_9c = -(local_a0 + iVar5 * -0x10000);
          }
          else {
            local_9c = local_a0 + iVar5 * -0x10000;
          }
          if ((local_9c < diff) && (local_9c < numBlueValues._4_4_)) {
            *(int *)((long)&(font_local->blend).font + _emBoxTop * 0x14) = iVar5 * 0x10000;
            diff = local_9c;
            if (local_9c == 0) break;
          }
        }
        if (1 < numFamilyOtherBlues) {
          iVar5 = (int)familyOtherBlues[1];
          if (local_a0 + iVar5 * -0x10000 < 0) {
            local_a0 = -(local_a0 + iVar5 * -0x10000);
          }
          else {
            local_a0 = local_a0 + iVar5 * -0x10000;
          }
          if ((local_a0 < diff) && (local_a0 < numBlueValues._4_4_)) {
            *(int *)((long)&(font_local->blend).font + _emBoxTop * 0x14) = iVar5 * 0x10000;
          }
        }
      }
    }
    if ((0 < local_28) &&
       (iVar5._0_1_ = font_local->isT1, iVar5._1_1_ = font_local->isCFF2,
       iVar5._2_2_ = *(undefined2 *)&font_local->field_0xe,
       FVar7 = FT_DivFix(0x10000,(long)local_28), FVar7 < iVar5)) {
      FVar7 = FT_DivFix(0x10000,(long)local_28);
      uVar8 = (undefined4)FVar7;
      font_local->isT1 = (char)uVar8;
      font_local->isCFF2 = (char)((uint)uVar8 >> 8);
      *(short *)&font_local->field_0xe = (short)((uint)uVar8 >> 0x10);
    }
    iVar1._0_1_ = font_local->isT1;
    iVar1._1_1_ = font_local->isCFF2;
    iVar1._2_2_ = *(undefined2 *)&font_local->field_0xe;
    if (*(int *)&font_local->memory < iVar1) {
      *(undefined1 *)&font_local->error = 1;
      iVar2._0_1_ = font_local->isT1;
      iVar2._1_1_ = font_local->isCFF2;
      iVar2._2_2_ = *(undefined2 *)&font_local->field_0xe;
      FVar7 = FT_MulDiv(0x999a,(long)*(int *)&font_local->memory,(long)iVar2);
      (font_local->currentTransform).b = 0x999a - (int)FVar7;
      if (0x7fff < (font_local->currentTransform).b) {
        (font_local->currentTransform).b = 0x7fff;
      }
    }
    if (*(char *)((long)decoder->stack + 0x92) != '\0') {
      (font_local->currentTransform).b = 0;
    }
    for (_emBoxTop = 0; _emBoxTop < *(uint *)((long)&font_local->memory + 4);
        _emBoxTop = _emBoxTop + 1) {
      if ((char)(&(font_local->blend).lastVsindex)[_emBoxTop * 5] == '\0') {
        FVar4 = FT_MulFix_x86_64(*(FT_Int32 *)((long)&(font_local->blend).font + _emBoxTop * 0x14),
                                 *(FT_Int32 *)&font_local->memory);
        *(uint *)((long)&(font_local->blend).font + _emBoxTop * 0x14 + 4) =
             FVar4 + (font_local->currentTransform).b + 0x8000U & 0xffff0000;
      }
      else {
        FVar4 = FT_MulFix_x86_64(*(FT_Int32 *)((long)&(font_local->blend).font + _emBoxTop * 0x14),
                                 *(FT_Int32 *)&font_local->memory);
        *(uint *)((long)&(font_local->blend).font + _emBoxTop * 0x14 + 4) =
             (FVar4 - (font_local->currentTransform).b) + 0x8000U & 0xffff0000;
      }
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_blues_init( CF2_Blues  blues,
                  CF2_Font   font )
  {
    /* pointer to parsed font object */
    PS_Decoder*  decoder = font->decoder;

    CF2_Fixed  zoneHeight;
    CF2_Fixed  maxZoneHeight = 0;
    CF2_Fixed  csUnitsPerPixel;

    size_t  numBlueValues;
    size_t  numOtherBlues;
    size_t  numFamilyBlues;
    size_t  numFamilyOtherBlues;

    FT_Pos*  blueValues;
    FT_Pos*  otherBlues;
    FT_Pos*  familyBlues;
    FT_Pos*  familyOtherBlues;

    size_t     i;
    CF2_Fixed  emBoxBottom, emBoxTop;

#if 0
    CF2_Int  unitsPerEm = font->unitsPerEm;


    if ( unitsPerEm == 0 )
      unitsPerEm = 1000;
#endif

    FT_ZERO( blues );
    blues->scale = font->innerTransform.d;

    cf2_getBlueMetrics( decoder,
                        &blues->blueScale,
                        &blues->blueShift,
                        &blues->blueFuzz );

    cf2_getBlueValues( decoder, &numBlueValues, &blueValues );
    cf2_getOtherBlues( decoder, &numOtherBlues, &otherBlues );
    cf2_getFamilyBlues( decoder, &numFamilyBlues, &familyBlues );
    cf2_getFamilyOtherBlues( decoder, &numFamilyOtherBlues, &familyOtherBlues );

    /*
     * synthetic em box hint heuristic
     *
     * Apply this when ideographic dictionary (LanguageGroup 1) has no
     * real alignment zones.  Adobe tools generate dummy zones at -250 and
     * 1100 for a 1000 unit em.  Fonts with ICF-based alignment zones
     * should not enable the heuristic.  When the heuristic is enabled,
     * the font's blue zones are ignored.
     *
     */

    /* get em box from OS/2 typoAscender/Descender                      */
    /* TODO: FreeType does not parse these metrics.  Skip them for now. */
#if 0
    FCM_getHorizontalLineMetrics( &e,
                                  font->font,
                                  &ascender,
                                  &descender,
                                  &linegap );
    if ( ascender - descender == unitsPerEm )
    {
      emBoxBottom = cf2_intToFixed( descender );
      emBoxTop    = cf2_intToFixed( ascender );
    }
    else
#endif
    {
      emBoxBottom = CF2_ICF_Bottom;
      emBoxTop    = CF2_ICF_Top;
    }

    if ( cf2_getLanguageGroup( decoder ) == 1                   &&
         ( numBlueValues == 0                                 ||
           ( numBlueValues == 4                             &&
             cf2_blueToFixed( blueValues[0] ) < emBoxBottom &&
             cf2_blueToFixed( blueValues[1] ) < emBoxBottom &&
             cf2_blueToFixed( blueValues[2] ) > emBoxTop    &&
             cf2_blueToFixed( blueValues[3] ) > emBoxTop    ) ) )
    {
      /*
       * Construct hint edges suitable for synthetic ghost hints at top
       * and bottom of em box.  +-CF2_MIN_COUNTER allows for unhinted
       * features above or below the last hinted edge.  This also gives a
       * net 1 pixel boost to the height of ideographic glyphs.
       *
       * Note: Adjust synthetic hints outward by epsilon (0x.0001) to
       *       avoid interference.  E.g., some fonts have real hints at
       *       880 and -120.
       */

      blues->emBoxBottomEdge.csCoord = emBoxBottom - CF2_FIXED_EPSILON;
      blues->emBoxBottomEdge.dsCoord = cf2_fixedRound(
                                         FT_MulFix(
                                           blues->emBoxBottomEdge.csCoord,
                                           blues->scale ) ) -
                                       CF2_MIN_COUNTER;
      blues->emBoxBottomEdge.scale   = blues->scale;
      blues->emBoxBottomEdge.flags   = CF2_GhostBottom |
                                       CF2_Locked |
                                       CF2_Synthetic;

      blues->emBoxTopEdge.csCoord = emBoxTop + CF2_FIXED_EPSILON +
                                    2 * font->darkenY;
      blues->emBoxTopEdge.dsCoord = cf2_fixedRound(
                                      FT_MulFix(
                                        blues->emBoxTopEdge.csCoord,
                                        blues->scale ) ) +
                                    CF2_MIN_COUNTER;
      blues->emBoxTopEdge.scale   = blues->scale;
      blues->emBoxTopEdge.flags   = CF2_GhostTop |
                                    CF2_Locked |
                                    CF2_Synthetic;

      blues->doEmBoxHints = TRUE;    /* enable the heuristic */

      return;
    }

    /* copy `BlueValues' and `OtherBlues' to a combined array of top and */
    /* bottom zones                                                      */
    for ( i = 0; i < numBlueValues; i += 2 )
    {
      blues->zone[blues->count].csBottomEdge =
        cf2_blueToFixed( blueValues[i] );
      blues->zone[blues->count].csTopEdge =
        cf2_blueToFixed( blueValues[i + 1] );

      zoneHeight = SUB_INT32( blues->zone[blues->count].csTopEdge,
                              blues->zone[blues->count].csBottomEdge );

      if ( zoneHeight < 0 )
      {
        FT_TRACE4(( "cf2_blues_init: ignoring negative zone height\n" ));
        continue;   /* reject this zone */
      }

      if ( zoneHeight > maxZoneHeight )
      {
        /* take maximum before darkening adjustment      */
        /* so overshoot suppression point doesn't change */
        maxZoneHeight = zoneHeight;
      }

      /* adjust both edges of top zone upward by twice darkening amount */
      if ( i != 0 )
      {
        blues->zone[blues->count].csTopEdge    += 2 * font->darkenY;
        blues->zone[blues->count].csBottomEdge += 2 * font->darkenY;
      }

      /* first `BlueValue' is bottom zone; others are top */
      if ( i == 0 )
      {
        blues->zone[blues->count].bottomZone =
          TRUE;
        blues->zone[blues->count].csFlatEdge =
          blues->zone[blues->count].csTopEdge;
      }
      else
      {
        blues->zone[blues->count].bottomZone =
          FALSE;
        blues->zone[blues->count].csFlatEdge =
          blues->zone[blues->count].csBottomEdge;
      }

      blues->count += 1;
    }

    for ( i = 0; i < numOtherBlues; i += 2 )
    {
      blues->zone[blues->count].csBottomEdge =
        cf2_blueToFixed( otherBlues[i] );
      blues->zone[blues->count].csTopEdge =
        cf2_blueToFixed( otherBlues[i + 1] );

      zoneHeight = SUB_INT32( blues->zone[blues->count].csTopEdge,
                              blues->zone[blues->count].csBottomEdge );

      if ( zoneHeight < 0 )
      {
        FT_TRACE4(( "cf2_blues_init: ignoring negative zone height\n" ));
        continue;   /* reject this zone */
      }

      if ( zoneHeight > maxZoneHeight )
      {
        /* take maximum before darkening adjustment      */
        /* so overshoot suppression point doesn't change */
        maxZoneHeight = zoneHeight;
      }

      /* Note: bottom zones are not adjusted for darkening amount */

      /* all OtherBlues are bottom zone */
      blues->zone[blues->count].bottomZone =
        TRUE;
      blues->zone[blues->count].csFlatEdge =
        blues->zone[blues->count].csTopEdge;

      blues->count += 1;
    }

    /* Adjust for FamilyBlues */

    /* Search for the nearest flat edge in `FamilyBlues' or                */
    /* `FamilyOtherBlues'.  According to the Black Book, any matching edge */
    /* must be within one device pixel                                     */

    csUnitsPerPixel = FT_DivFix( cf2_intToFixed( 1 ), blues->scale );

    /* loop on all zones in this font */
    for ( i = 0; i < blues->count; i++ )
    {
      size_t     j;
      CF2_Fixed  minDiff;
      CF2_Fixed  flatFamilyEdge, diff;
      /* value for this font */
      CF2_Fixed  flatEdge = blues->zone[i].csFlatEdge;


      if ( blues->zone[i].bottomZone )
      {
        /* In a bottom zone, the top edge is the flat edge.             */
        /* Search `FamilyOtherBlues' for bottom zones; look for closest */
        /* Family edge that is within the one pixel threshold.          */

        minDiff = CF2_FIXED_MAX;

        for ( j = 0; j < numFamilyOtherBlues; j += 2 )
        {
          /* top edge */
          flatFamilyEdge = cf2_blueToFixed( familyOtherBlues[j + 1] );

          diff = cf2_fixedAbs( SUB_INT32( flatEdge, flatFamilyEdge ) );

          if ( diff < minDiff && diff < csUnitsPerPixel )
          {
            blues->zone[i].csFlatEdge = flatFamilyEdge;
            minDiff                   = diff;

            if ( diff == 0 )
              break;
          }
        }

        /* check the first member of FamilyBlues, which is a bottom zone */
        if ( numFamilyBlues >= 2 )
        {
          /* top edge */
          flatFamilyEdge = cf2_blueToFixed( familyBlues[1] );

          diff = cf2_fixedAbs( SUB_INT32( flatEdge, flatFamilyEdge ) );

          if ( diff < minDiff && diff < csUnitsPerPixel )
            blues->zone[i].csFlatEdge = flatFamilyEdge;
        }
      }
      else
      {
        /* In a top zone, the bottom edge is the flat edge.                */
        /* Search `FamilyBlues' for top zones; skip first zone, which is a */
        /* bottom zone; look for closest Family edge that is within the    */
        /* one pixel threshold                                             */

        minDiff = CF2_FIXED_MAX;

        for ( j = 2; j < numFamilyBlues; j += 2 )
        {
          /* bottom edge */
          flatFamilyEdge = cf2_blueToFixed( familyBlues[j] );

          /* adjust edges of top zone upward by twice darkening amount */
          flatFamilyEdge += 2 * font->darkenY;      /* bottom edge */

          diff = cf2_fixedAbs( SUB_INT32( flatEdge, flatFamilyEdge ) );

          if ( diff < minDiff && diff < csUnitsPerPixel )
          {
            blues->zone[i].csFlatEdge = flatFamilyEdge;
            minDiff                   = diff;

            if ( diff == 0 )
              break;
          }
        }
      }
    }

    /* TODO: enforce separation of zones, including BlueFuzz */

    /* Adjust BlueScale; similar to AdjustBlueScale() in coretype */
    /* `bcsetup.c'.                                               */

    if ( maxZoneHeight > 0 )
    {
      if ( blues->blueScale > FT_DivFix( cf2_intToFixed( 1 ),
                                         maxZoneHeight ) )
      {
        /* clamp at maximum scale */
        blues->blueScale = FT_DivFix( cf2_intToFixed( 1 ),
                                      maxZoneHeight );
      }

      /*
       * TODO: Revisit the bug fix for 613448.  The minimum scale
       *       requirement catches a number of library fonts.  For
       *       example, with default BlueScale (.039625) and 0.4 minimum,
       *       the test below catches any font with maxZoneHeight < 10.1.
       *       There are library fonts ranging from 2 to 10 that get
       *       caught, including e.g., Eurostile LT Std Medium with
       *       maxZoneHeight of 6.
       *
       */
#if 0
      if ( blueScale < .4 / maxZoneHeight )
      {
        tetraphilia_assert( 0 );
        /* clamp at minimum scale, per bug 0613448 fix */
        blueScale = .4 / maxZoneHeight;
      }
#endif

    }

    /*
     * Suppress overshoot and boost blue zones at small sizes.  Boost
     * amount varies linearly from 0.5 pixel near 0 to 0 pixel at
     * blueScale cutoff.
     * Note: This boost amount is different from the coretype heuristic.
     *
     */

    if ( blues->scale < blues->blueScale )
    {
      blues->suppressOvershoot = TRUE;

      /* Change rounding threshold for `dsFlatEdge'.                    */
      /* Note: constant changed from 0.5 to 0.6 to avoid a problem with */
      /*       10ppem Arial                                             */

      blues->boost = cf2_doubleToFixed( .6 ) -
                       FT_MulDiv( cf2_doubleToFixed ( .6 ),
                                  blues->scale,
                                  blues->blueScale );
      if ( blues->boost > 0x7FFF )
      {
        /* boost must remain less than 0.5, or baseline could go negative */
        blues->boost = 0x7FFF;
      }
    }

    /* boost and darkening have similar effects; don't do both */
    if ( font->stemDarkened )
      blues->boost = 0;

    /* set device space alignment for each zone;    */
    /* apply boost amount before rounding flat edge */

    for ( i = 0; i < blues->count; i++ )
    {
      if ( blues->zone[i].bottomZone )
        blues->zone[i].dsFlatEdge = cf2_fixedRound(
                                      FT_MulFix(
                                        blues->zone[i].csFlatEdge,
                                        blues->scale ) -
                                      blues->boost );
      else
        blues->zone[i].dsFlatEdge = cf2_fixedRound(
                                      FT_MulFix(
                                        blues->zone[i].csFlatEdge,
                                        blues->scale ) +
                                      blues->boost );
    }
  }